

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

bool canBeNumericallyCompared(QMetaTypeInterface *iface1,QMetaTypeInterface *iface2)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (iface2 == (QMetaTypeInterface *)0x0 || iface1 == (QMetaTypeInterface *)0x0) {
    bVar3 = false;
  }
  else {
    uVar1 = (iface1->typeId)._q_value.super___atomic_base<int>._M_i;
    bVar4 = (1L << ((byte)uVar1 & 0x3f) & 0x8300017f0000047eU) != 0;
    uVar2 = (iface2->typeId)._q_value.super___atomic_base<int>._M_i;
    bVar5 = (1L << ((byte)uVar2 & 0x3f) & 0x8300017f0000047eU) != 0;
    bVar3 = true;
    if ((!bVar4 || uVar1 >= 0x40) || (!bVar5 || uVar2 >= 0x40)) {
      if ((iface2->flags & 0x10) == 0 || (iface1->flags & 0x10) == 0) {
        bVar3 = (bVar4 && uVar1 < 0x40) && (iface2->flags & 0x10) != 0 ||
                (bVar5 && uVar2 < 0x40) && (iface1->flags & 0x10) != 0;
      }
      else {
        local_18.d_ptr = iface2;
        local_10.d_ptr = iface1;
        bVar3 = comparesEqual(&local_10,&local_18);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool canBeNumericallyCompared(const QtPrivate::QMetaTypeInterface *iface1,
                                     const QtPrivate::QMetaTypeInterface *iface2)
{
    if (!iface1 || !iface2)
        return false;

    // We don't need QMetaType::id() here because the type Id is always stored
    // directly for all built-in types.
    bool isNumeric1 = qIsNumericType(iface1->typeId);
    bool isNumeric2 = qIsNumericType(iface2->typeId);

    // if they're both numeric (or QString), then they can be compared
    if (isNumeric1 && isNumeric2)
        return true;

    bool isEnum1 = iface1->flags & QMetaType::IsEnumeration;
    bool isEnum2 = iface2->flags & QMetaType::IsEnumeration;

    // if both are enums, we can only compare if they are the same enum
    // (the language does allow comparing two different enum types, but that's
    // usually considered poor coding and produces a warning)
    if (isEnum1 && isEnum2)
        return QMetaType(iface1) == QMetaType(iface2);

    // if one is an enum and the other is a numeric, we can compare too
    if (isEnum1 && isNumeric2)
        return true;
    if (isNumeric1 && isEnum2)
        return true;

    // we need at least one enum and one numeric...
    return false;
}